

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localizer.cpp
# Opt level: O2

void __thiscall
ary::PlanarLocalization::draw(PlanarLocalization *this,Mat *image,SharedCameraModel *model)

{
  pointer pPVar1;
  long lVar2;
  int i;
  ulong uVar3;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  SharedCameraModel *local_98;
  undefined4 local_90 [2];
  Mat *local_88;
  undefined8 local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  Matx<double,_4,_1> local_68;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  uVar3 = 1;
  local_78 = 0;
  uStack_74 = 0;
  uStack_70 = 0;
  uStack_6c = 0x406fe000;
  local_98 = model;
  while( true ) {
    pPVar1 = (this->corners).
             super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar2 = (long)(this->corners).
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
                  .super__Vector_impl_data._M_finish - (long)pPVar1;
    local_88 = image;
    if ((ulong)(lVar2 >> 3) <= uVar3) break;
    local_80 = 0;
    local_90[0] = 0x3010000;
    local_a0 = (int)ROUND(pPVar1[uVar3 - 1].x);
    local_9c = (int)ROUND(pPVar1[uVar3 - 1].y);
    local_a8 = (int)ROUND(pPVar1[uVar3].x);
    local_a4 = (int)ROUND(pPVar1[uVar3].y);
    cv::Matx<double,_4,_1>::Matx(&local_68);
    local_68.val[0] = (double)CONCAT44(uStack_74,local_78);
    local_68.val[1] = (double)CONCAT44(uStack_6c,uStack_70);
    local_68.val[2] = 0.0;
    local_68.val[3] = 0.0;
    cv::line(local_90,&local_a0,&local_a8,&local_68,4,8,0);
    uVar3 = uVar3 + 1;
  }
  local_80 = 0;
  local_90[0] = 0x3010000;
  local_38 = (int)ROUND(*(float *)((long)pPVar1 + lVar2 + -8));
  local_34 = (int)ROUND(*(float *)((long)pPVar1 + lVar2 + -4));
  local_40 = (int)ROUND(pPVar1->x);
  local_3c = (int)ROUND(pPVar1->y);
  cv::Matx<double,_4,_1>::Matx(&local_68);
  local_68.val[0] = 0.0;
  local_68.val[1] = 255.0;
  local_68.val[2] = 0.0;
  local_68.val[3] = 0.0;
  cv::line(local_90,&local_38,&local_40,&local_68,4,8,0);
  Localization::draw(&this->super_Localization,image,local_98);
  return;
}

Assistant:

void PlanarLocalization::draw(cv::Mat& image, SharedCameraModel& model) const {


    for (int i = 1; i < corners.size(); i++) {
	    line(image, corners[i-1], corners[i], Scalar(0, 255, 0), 4);
    }
    line(image, corners[corners.size()-1], corners[0], Scalar(0, 255, 0), 4);

    Localization::draw(image, model);

}